

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_object_preventExtensions
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int reflect)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  int64_t iVar4;
  JSValue JVar5;
  
  piVar3 = (int *)(argv->u).ptr;
  iVar4 = argv->tag;
  if ((uint)iVar4 == 0xffffffff) {
    if (*(short *)((long)piVar3 + 6) == 0x29) {
      iVar1 = js_proxy_preventExtensions(ctx,*argv);
      if (-1 < iVar1) {
        if (reflect != 0) goto LAB_0015ecb2;
        if (iVar1 != 0) goto LAB_0015ece8;
        JS_ThrowTypeError(ctx,"proxy preventExtensions handler returned false");
      }
      piVar3 = (int *)0x0;
      uVar2 = 0;
      iVar4 = 6;
      goto LAB_0015ecf7;
    }
    *(byte *)((long)piVar3 + 5) = *(byte *)((long)piVar3 + 5) & 0xfe;
    iVar1 = 1;
    if (reflect == 0) {
LAB_0015ece8:
      *piVar3 = *piVar3 + 1;
      goto LAB_0015ecea;
    }
LAB_0015ecb2:
    piVar3 = (int *)(ulong)(iVar1 != 0);
    iVar4 = 1;
  }
  else {
    if (reflect == 0) {
      if (0xfffffff4 < (uint)iVar4) goto LAB_0015ece8;
LAB_0015ecea:
      uVar2 = (ulong)piVar3 & 0xffffffff00000000;
      goto LAB_0015ecf7;
    }
    piVar3 = (int *)0x0;
    JS_ThrowTypeError(ctx,"not an object",this_val.tag);
    iVar4 = 6;
  }
  uVar2 = 0;
LAB_0015ecf7:
  JVar5.u.ptr = (void *)((ulong)piVar3 & 0xffffffff | uVar2);
  JVar5.tag = iVar4;
  return JVar5;
}

Assistant:

static JSValue js_object_preventExtensions(JSContext *ctx, JSValueConst this_val,
                                           int argc, JSValueConst *argv, int reflect)
{
    JSValueConst obj;
    int ret;

    obj = argv[0];
    if (JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT) {
        if (reflect)
            return JS_ThrowTypeErrorNotAnObject(ctx);
        else
            return JS_DupValue(ctx, obj);
    }
    ret = JS_PreventExtensions(ctx, obj);
    if (ret < 0)
        return JS_EXCEPTION;
    if (reflect) {
        return JS_NewBool(ctx, ret);
    } else {
        if (!ret)
            return JS_ThrowTypeError(ctx, "proxy preventExtensions handler returned false");
        return JS_DupValue(ctx, obj);
    }
}